

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtarjan.c
# Opt level: O1

void RDL_deleteBCCGraph(RDL_BCCGraph *graph)

{
  ulong uVar1;
  
  if (graph->nof_bcc != 0) {
    uVar1 = 0;
    do {
      RDL_deleteGraph(graph->bcc_graphs[uVar1]);
      free(graph->edge_from_bcc_mapping[uVar1]);
      free(graph->node_from_bcc_mapping[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < graph->nof_bcc);
  }
  free(graph->bcc_graphs);
  free(graph->edge_from_bcc_mapping);
  free(graph->node_from_bcc_mapping);
  free(graph->nof_edges_per_bcc);
  free(graph->nof_nodes_per_bcc);
  if (graph->complete_graph->V != 0) {
    uVar1 = 0;
    do {
      free(graph->node_to_bcc_mapping[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < graph->complete_graph->V);
  }
  free(graph->node_to_bcc_mapping);
  if (graph->complete_graph->E != 0) {
    uVar1 = 0;
    do {
      free(graph->edge_to_bcc_mapping[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < graph->complete_graph->E);
  }
  free(graph->edge_to_bcc_mapping);
  free(graph->nof_bcc_per_node);
  free(graph);
  return;
}

Assistant:

void RDL_deleteBCCGraph(RDL_BCCGraph* graph)
{
  unsigned i;

  for (i = 0; i < graph->nof_bcc; ++i) {
    RDL_deleteGraph(graph->bcc_graphs[i]);
    free(graph->edge_from_bcc_mapping[i]);
    free(graph->node_from_bcc_mapping[i]);
  }
  free(graph->bcc_graphs);
  free(graph->edge_from_bcc_mapping);
  free(graph->node_from_bcc_mapping);
  free(graph->nof_edges_per_bcc);
  free(graph->nof_nodes_per_bcc);

  for (i = 0; i < graph->complete_graph->V; ++i) {
    free(graph->node_to_bcc_mapping[i]);
  }
  free(graph->node_to_bcc_mapping);

  for (i = 0; i < graph->complete_graph->E; ++i) {
    free(graph->edge_to_bcc_mapping[i]);
  }
  free(graph->edge_to_bcc_mapping);
  free(graph->nof_bcc_per_node);
  free(graph);
}